

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBufferTestUtil.cpp
# Opt level: O2

char * deqp::gls::BufferTestUtil::getUsageHintName(deUint32 hint)

{
  if (hint - 0x88e0 < 0xb) {
    return (&PTR_anon_var_dwarf_15a920d_01e779b8)[hint - 0x88e0];
  }
  return (char *)0x0;
}

Assistant:

const char* getUsageHintName (deUint32 hint)
{
	switch (hint)
	{
		case GL_STREAM_DRAW:	return "stream_draw";
		case GL_STREAM_READ:	return "stream_read";
		case GL_STREAM_COPY:	return "stream_copy";
		case GL_STATIC_DRAW:	return "static_draw";
		case GL_STATIC_READ:	return "static_read";
		case GL_STATIC_COPY:	return "static_copy";
		case GL_DYNAMIC_DRAW:	return "dynamic_draw";
		case GL_DYNAMIC_READ:	return "dynamic_read";
		case GL_DYNAMIC_COPY:	return "dynamic_copy";
		default:
			DE_ASSERT(false);
			return DE_NULL;
	}
}